

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

int __thiscall
CVmObjFileName::getp_forEachFile(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  vm_val_t *pvVar3;
  undefined8 *puVar4;
  long *plVar5;
  vm_filnam_ext *this_00;
  CVmRun *this_01;
  uint *in_RCX;
  CVmObjFileName *in_RDI;
  err_frame_t err_cur__;
  int recursive;
  CVmNetFile *netfile;
  vm_rcdesc rc;
  uint argc;
  vm_val_t *in_stack_fffffffffffffe58;
  void *pvVar6;
  CVmNetFile *in_stack_fffffffffffffe60;
  undefined8 uVar7;
  vm_val_t *in_stack_fffffffffffffe68;
  CVmNetFile *this_02;
  vm_rcdesc *in_stack_fffffffffffffe70;
  uint uVar8;
  uint local_178 [2];
  undefined8 local_170;
  void *local_168;
  __jmp_buf_tag _Stack_160;
  int local_94;
  CVmNetFile *local_90;
  vm_rcdesc local_88;
  uint local_2c;
  
  if (in_RCX == (uint *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = *in_RCX;
  }
  local_2c = uVar8;
  if ((getp_forEachFile(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_forEachFile(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_forEachFile::desc,1,1);
    __cxa_guard_release(&getp_forEachFile(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_fffffffffffffe68,(uint *)in_stack_fffffffffffffe60,
                     (CVmNativeCodeDesc *)in_stack_fffffffffffffe58);
  if (iVar1 == 0) {
    vVar2 = CVmMetaclass::get_class_obj((CVmMetaclass *)in_stack_fffffffffffffe70);
    CVmStack::get(0);
    vm_rcdesc::vm_rcdesc
              (in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
               (vm_obj_id_t)((ulong)in_stack_fffffffffffffe60 >> 0x20),
               (unsigned_short)((ulong)in_stack_fffffffffffffe60 >> 0x10),in_stack_fffffffffffffe58,
               0);
    local_90 = CVmObjFile::get_filename_from_obj
                         ((vm_obj_id_t)((ulong)in_RDI >> 0x20),(vm_rcdesc *)CONCAT44(uVar8,vVar2),
                          (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                          (os_filetype_t)in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68
                         );
    local_94 = 0;
    if (1 < local_2c) {
      pvVar3 = CVmStack::get(1);
      iVar1 = vm_val_t::is_logical(pvVar3);
      if (iVar1 == 0) {
        err_throw(0);
      }
      pvVar3 = CVmStack::get(1);
      local_94 = vm_val_t::get_logical(pvVar3);
    }
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    local_170 = *puVar4;
    plVar5 = (long *)_ZTW11G_err_frame();
    *plVar5 = (long)local_178;
    local_178[0] = _setjmp(&_Stack_160);
    if (local_178[0] == 0) {
      this_02 = local_90;
      this_00 = get_ext(in_RDI);
      this_01 = (CVmRun *)vm_filnam_ext::get_str(this_00);
      pvVar3 = CVmStack::get(0);
      iVar1 = CVmNetFile::readdir_cb(this_02,(char *)this_01,&local_88,pvVar3,local_94);
      if (iVar1 == 0) {
        CVmRun::throw_new_class
                  (this_01,(vm_obj_id_t)((ulong)this_02 >> 0x20),(uint)this_02,
                   (char *)in_stack_fffffffffffffe60);
      }
    }
    if ((local_178[0] & 0x8000) == 0) {
      local_178[0] = local_178[0] | 0x8000;
      CVmNetFile::abandon(in_stack_fffffffffffffe60);
    }
    uVar7 = local_170;
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    *puVar4 = uVar7;
    if ((local_178[0] & 0x4001) != 0) {
      puVar4 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar4 & 2) != 0) {
        plVar5 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar5 + 0x10));
      }
      pvVar6 = local_168;
      plVar5 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar5 + 0x10) = pvVar6;
      err_rethrow();
    }
    if ((local_178[0] & 2) != 0) {
      free(local_168);
    }
    CVmStack::discard(local_2c);
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_forEachFile(VMG_ vm_obj_id_t self,
                                     vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the filename; use the READ DIR access mode */
    vm_rcdesc rc(vmg_ "FileName.forEachFile",
                 metaclass_reg_->get_class_obj(vmg0_),
                 VMOFN_FOREACHFILE, G_stk->get(0), argc);
    CVmNetFile *netfile = CVmObjFile::get_filename_from_obj(
        vmg_ self, &rc, VMOBJFILE_ACCESS_READDIR,
        OSFTUNK, "application/octet-stream");

    /* get the 'recursive' flag, if present */
    int recursive = FALSE;
    if (argc >= 2)
    {
        if (G_stk->get(1)->is_logical())
            recursive = G_stk->get(1)->get_logical();
        else
            err_throw(VMERR_BAD_TYPE_BIF);
    }

    err_try
    {
        /* do the directory enumeration through the callback */
        if (!netfile->readdir_cb(vmg_ get_ext()->get_str(),
                                 &rc, G_stk->get(0), recursive))
            G_interpreter->throw_new_class(vmg_ G_predef->file_open_exc,
                                           0, "error reading directory");
    }